

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_io_object.hpp
# Opt level: O0

void __thiscall
boost::asio::
basic_io_object<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
::basic_io_object(basic_io_object<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
                  *this,io_context *io_context)

{
  deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *pdVar1;
  deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *in_RDI;
  implementation_type *in_stack_ffffffffffffffc8;
  implementation_type *in_stack_ffffffffffffffe0;
  
  pdVar1 = use_service<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,boost::asio::wait_traits<std::chrono::_V2::steady_clock>>>>
                     ((io_context *)0x13c142);
  (in_RDI->
  super_service_base<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>
  ).super_service.super_service._vptr_service = (_func_int **)pdVar1;
  detail::
  deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  ::implementation_type::implementation_type(in_stack_ffffffffffffffe0);
  detail::
  deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  ::construct(in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

explicit basic_io_object(boost::asio::io_context& io_context)
    : service_(&boost::asio::use_service<IoObjectService>(io_context))
  {
    service_->construct(implementation_);
  }